

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_options.c
# Opt level: O2

void xx(OnigOptionType options,char *pattern,char *str,int from,int to,int mem,int not,int error_no,
       int line_no)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  regex_t *reg;
  OnigErrorInfo einfo;
  char s [90];
  undefined1 *puVar6;
  undefined8 uVar7;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  undefined1 local_98 [104];
  undefined4 uVar8;
  
  sVar3 = strlen(pattern);
  puVar6 = local_b0;
  iVar2 = onig_new(&local_b8,pattern,pattern + sVar3,options,&OnigEncodingUTF8,_OnigDefaultSyntax,
                   puVar6);
  uVar1 = local_b8;
  uVar8 = (undefined4)((ulong)puVar6 >> 0x20);
  if (iVar2 != 0) {
    onig_error_code_to_str(local_98,iVar2,local_b0);
LAB_001018f0:
    fprintf((FILE *)err_file,"ERROR: %s  /%s/  #%d\n",local_98,pattern,(ulong)(uint)error_no);
    nerror = nerror + 1;
    return;
  }
  sVar3 = strlen(str);
  uVar7 = CONCAT44(uVar8,options);
  iVar2 = onig_search(uVar1,str,str + sVar3,str,str + sVar3,region,uVar7);
  if (iVar2 < -1) {
    onig_error_code_to_str(local_98,iVar2);
    goto LAB_001018f0;
  }
  if (iVar2 == -1) {
    if (not != 0) {
      pcVar5 = "OK(N): /%s/ \'%s\'  #%d\n";
LAB_001019a5:
      fprintf(_stdout,pcVar5,pattern,str);
      piVar4 = &nsucc;
      goto LAB_001019d6;
    }
    pcVar5 = "FAIL: /%s/ \'%s\'  #%d\n";
LAB_001019c2:
    fprintf(_stdout,pcVar5,pattern,str);
  }
  else {
    if (not != 0) {
      pcVar5 = "FAIL(N): /%s/ \'%s\'  #%d\n";
      goto LAB_001019c2;
    }
    if (region->end[(uint)mem] == to && region->beg[(uint)mem] == from) {
      pcVar5 = "OK: /%s/ \'%s\'  #%d\n";
      goto LAB_001019a5;
    }
    fprintf(_stdout,"FAIL: /%s/ \'%s\' %d-%d : %d-%d  #%d\n",pattern,str,(ulong)(uint)from,
            (ulong)(uint)to,CONCAT44((int)((ulong)uVar7 >> 0x20),region->beg[(uint)mem]),
            region->end[(uint)mem],error_no);
  }
  piVar4 = &nfail;
LAB_001019d6:
  *piVar4 = *piVar4 + 1;
  onig_free(local_b8);
  return;
}

Assistant:

static void xx(OnigOptionType options, char* pattern, char* str,
               int from, int to, int mem, int not, int error_no, int line_no)
{
#ifdef __TRUSTINSOFT_ANALYZER__
  if (nall++ % TIS_TEST_CHOOSE_MAX != TIS_TEST_CHOOSE_CURRENT) return;
#endif

  int r;
  regex_t* reg;
  OnigErrorInfo einfo;

  r = onig_new(&reg, (UChar* )pattern, (UChar* )(pattern + SLEN(pattern)),
         options, ONIG_ENCODING_UTF8, ONIG_SYNTAX_DEFAULT, &einfo);
  if (r) {
    char s[ONIG_MAX_ERROR_MESSAGE_LEN];

    if (error_no == 0) {
      onig_error_code_to_str((UChar* )s, r, &einfo);
      fprintf(err_file, "ERROR: %s  /%s/  #%d\n", s, pattern, line_no);
      nerror++;
    }
    else {
      if (r == error_no) {
        fprintf(stdout, "OK(ERROR): /%s/ %d  #%d\n", pattern, r, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL(ERROR): /%s/ '%s', %d, %d  #%d\n", pattern, str,
                error_no, r, line_no);
        nfail++;
      }
    }

    return ;
  }

  r = onig_search(reg, (UChar* )str, (UChar* )(str + SLEN(str)),
                  (UChar* )str, (UChar* )(str + SLEN(str)),
                  region, options);
  if (r < ONIG_MISMATCH || error_no < ONIG_MISMATCH) {
    char s[ONIG_MAX_ERROR_MESSAGE_LEN];

    if (error_no == 0) {
      onig_error_code_to_str((UChar* )s, r);
      fprintf(err_file, "ERROR: %s  /%s/  #%d\n", s, pattern, line_no);
      nerror++;
    }
    else {
      if (r == error_no) {
        fprintf(stdout, "OK(ERROR): /%s/ '%s', %d  #%d\n",
                pattern, str, r, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL ERROR NO: /%s/ '%s', %d, %d  #%d\n",
                pattern, str, error_no, r, line_no);
        nfail++;
      }
    }

    return ;
  }

  if (r == ONIG_MISMATCH) {
    if (not) {
      fprintf(stdout, "OK(N): /%s/ '%s'  #%d\n", pattern, str, line_no);
      nsucc++;
    }
    else {
      fprintf(stdout, "FAIL: /%s/ '%s'  #%d\n", pattern, str, line_no);
      nfail++;
    }
  }
  else {
    if (not) {
      fprintf(stdout, "FAIL(N): /%s/ '%s'  #%d\n", pattern, str, line_no);
      nfail++;
    }
    else {
      if (region->beg[mem] == from && region->end[mem] == to) {
        fprintf(stdout, "OK: /%s/ '%s'  #%d\n", pattern, str, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL: /%s/ '%s' %d-%d : %d-%d  #%d\n", pattern, str,
                from, to, region->beg[mem], region->end[mem], line_no);
        nfail++;
      }
    }
  }
  onig_free(reg);
}